

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  float fVar4;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdc;
  byte in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 uVar5;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  int iVar6;
  undefined2 in_stack_ffffffffffffffec;
  byte in_stack_ffffffffffffffee;
  byte in_stack_ffffffffffffffef;
  ImVec2 in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x103f,"EndFrame","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (pIVar1->FrameCountEnded != pIVar1->FrameCount) {
    if ((pIVar1->WithinFrameScope & 1U) == 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1044,"EndFrame","ImGui ASSERT FAILED: %s",
                  "g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"");
    }
    ErrorCheckEndFrameSanityChecks();
    uVar5 = false;
    if ((pIVar1->IO).ImeSetInputScreenPosFn != (_func_void_int_int *)0x0) {
      fVar4 = (pIVar1->PlatformImeLastPos).x;
      in_stack_ffffffffffffffde = true;
      if ((fVar4 != 3.4028235e+38) || (uVar5 = in_stack_ffffffffffffffde, NAN(fVar4))) {
        in_stack_fffffffffffffff0 =
             ::operator-((ImVec2 *)
                         (ulong)CONCAT16(1,CONCAT15(in_stack_ffffffffffffffdd,
                                                    CONCAT14(in_stack_ffffffffffffffdc,
                                                             in_stack_ffffffffffffffd8))),
                         (ImVec2 *)0x2fdec4);
        fVar4 = ImLengthSqr((ImVec2 *)&stack0xfffffffffffffff0);
        in_stack_ffffffffffffffde = 0.0001 < fVar4;
        uVar5 = in_stack_ffffffffffffffde;
      }
    }
    if ((bool)uVar5 != false) {
      (*(pIVar1->IO).ImeSetInputScreenPosFn)
                ((int)(pIVar1->PlatformImePos).x,(int)(pIVar1->PlatformImePos).y);
      pIVar1->PlatformImeLastPos = pIVar1->PlatformImePos;
    }
    pIVar1->WithinFrameScopeWithImplicitWindow = false;
    if ((pIVar1->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((pIVar1->CurrentWindow->WriteAccessed & 1U) == 0)) {
      pIVar1->CurrentWindow->Active = false;
    }
    End();
    NavEndFrame();
    if ((pIVar1->DragDropActive & 1U) != 0) {
      in_stack_ffffffffffffffef = (pIVar1->DragDropPayload).Delivery & 1;
      in_stack_ffffffffffffffdd = 0;
      if (((pIVar1->DragDropPayload).DataFrameCount + 1 < pIVar1->FrameCount) &&
         (in_stack_ffffffffffffffdc = 1, in_stack_ffffffffffffffdd = in_stack_ffffffffffffffdc,
         (pIVar1->DragDropSourceFlags & 0x20U) == 0)) {
        bVar2 = IsMouseDown((ImGuiMouseButton)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
        in_stack_ffffffffffffffdc = bVar2 ^ 0xff;
        in_stack_ffffffffffffffdd = in_stack_ffffffffffffffdc;
      }
      in_stack_ffffffffffffffee = in_stack_ffffffffffffffdd & 1;
      if (((in_stack_ffffffffffffffef & 1) != 0) || (in_stack_ffffffffffffffee != 0)) {
        ClearDragDrop();
      }
    }
    if ((((pIVar1->DragDropActive & 1U) != 0) &&
        (pIVar1->DragDropSourceFrameCount < pIVar1->FrameCount)) &&
       ((pIVar1->DragDropSourceFlags & 1U) == 0)) {
      pIVar1->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar1->DragDropWithinSource = false;
    }
    pIVar1->WithinFrameScope = false;
    pIVar1->FrameCountEnded = pIVar1->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    ImVector<ImGuiWindow_*>::resize
              ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    ImVector<ImGuiWindow_*>::reserve
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
               CONCAT13(in_stack_ffffffffffffffef,
                        CONCAT12(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec)));
    for (iVar6 = 0; iVar6 != (pIVar1->Windows).Size; iVar6 = iVar6 + 1) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
                           CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffde,
                                                   CONCAT11(in_stack_ffffffffffffffdd,
                                                            in_stack_ffffffffffffffdc))));
      in_stack_ffffffffffffffe0 = *ppIVar3;
      if (((in_stack_ffffffffffffffe0->Active & 1U) == 0) ||
         ((in_stack_ffffffffffffffe0->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer
                  ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
                   (ImGuiWindow *)
                   CONCAT17(in_stack_ffffffffffffffef,
                            CONCAT16(in_stack_ffffffffffffffee,
                                     CONCAT24(in_stack_ffffffffffffffec,iVar6))));
      }
    }
    if ((pIVar1->Windows).Size != (pIVar1->WindowsTempSortBuffer).Size) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x107d,"EndFrame","ImGui ASSERT FAILED: %s",
                  "g.Windows.Size == g.WindowsTempSortBuffer.Size");
    }
    ImVector<ImGuiWindow_*>::swap(&pIVar1->Windows,&pIVar1->WindowsTempSortBuffer);
    (pIVar1->IO).MetricsActiveWindows = pIVar1->WindowsActiveCount;
    ((pIVar1->IO).Fonts)->Locked = false;
    (pIVar1->IO).MouseWheelH = 0.0;
    (pIVar1->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    memset((pIVar1->IO).NavInputs,0,0x54);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}